

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QBoxLayoutItem * __thiscall
QList<QBoxLayoutItem_*>::takeAt(QList<QBoxLayoutItem_*> *this,qsizetype i)

{
  QBoxLayoutItem *pQVar1;
  pointer ppQVar2;
  
  ppQVar2 = data(this);
  pQVar1 = ppQVar2[i];
  remove(this,(char *)i);
  return pQVar1;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }